

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.cpp
# Opt level: O1

bool IsUnixSocketPath(string *name)

{
  size_type __pos;
  int iVar1;
  long in_FS_OFFSET;
  bool bVar2;
  string str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  long local_20;
  
  __pos = ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length;
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if ((name->_M_string_length < ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length) ||
     ((ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length != 0 &&
      (iVar1 = bcmp((name->_M_dataplus)._M_p,ADDR_PREFIX_UNIX_abi_cxx11_._M_dataplus._M_p,
                    ADDR_PREFIX_UNIX_abi_cxx11_._M_string_length), iVar1 != 0)))) {
    bVar2 = false;
  }
  else {
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
              (&local_40,name,__pos,0xffffffffffffffff);
    bVar2 = local_40._M_string_length + 1 < 0x6d;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_20) {
    __stack_chk_fail();
  }
  return bVar2;
}

Assistant:

bool IsUnixSocketPath(const std::string& name)
{
#ifdef HAVE_SOCKADDR_UN
    if (!name.starts_with(ADDR_PREFIX_UNIX)) return false;

    // Split off "unix:" prefix
    std::string str{name.substr(ADDR_PREFIX_UNIX.length())};

    // Path size limit is platform-dependent
    // see https://manpages.ubuntu.com/manpages/xenial/en/man7/unix.7.html
    if (str.size() + 1 > sizeof(((sockaddr_un*)nullptr)->sun_path)) return false;

    return true;
#else
    return false;
#endif
}